

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O1

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key,
          uint64_t val)

{
  bool bVar1;
  uint64_t uVar2;
  ulong slot_id_00;
  ulong quo;
  uint64_t slot_id;
  uint64_t empty_id;
  uint64_t local_c8;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> local_c0;
  
  if (this->max_size_ <= this->size_) {
    compact_hash_table(&local_c0,(this->univ_size_).bits_,(this->capa_size_).bits_ + 1);
    compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>::
    clone<poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>::set_mapper>
              ((compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher> *)this,&local_c0
               ,(set_mapper *)&local_c8);
    (this->hasher_).univ_size_.mask_ = local_c0.hasher_.univ_size_.mask_;
    (this->hasher_).shift_ = local_c0.hasher_.shift_;
    *(undefined4 *)&(this->hasher_).field_0x4 = local_c0.hasher_._4_4_;
    (this->hasher_).univ_size_.bits_ = local_c0.hasher_.univ_size_.bits_;
    *(undefined4 *)&(this->hasher_).univ_size_.field_0x4 = local_c0.hasher_.univ_size_._4_4_;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&(this->table_).chunks_,&local_c0.table_);
    (this->table_).width_ = local_c0.table_.width_;
    (this->table_).size_ = local_c0.table_.size_;
    (this->table_).mask_ = local_c0.table_.mask_;
    (this->univ_size_).bits_ = local_c0.univ_size_.bits_;
    *(undefined4 *)&(this->univ_size_).field_0x4 = local_c0.univ_size_._4_4_;
    (this->univ_size_).mask_ = local_c0.univ_size_.mask_;
    (this->capa_size_).bits_ = local_c0.capa_size_.bits_;
    *(undefined4 *)&(this->capa_size_).field_0x4 = local_c0.capa_size_._4_4_;
    (this->capa_size_).mask_ = local_c0.capa_size_.mask_;
    (this->quo_size_).bits_ = local_c0.quo_size_.bits_;
    *(undefined4 *)&(this->quo_size_).field_0x4 = local_c0.quo_size_._4_4_;
    (this->quo_size_).mask_ = local_c0.quo_size_.mask_;
    this->quo_shift_ = local_c0.quo_shift_;
    this->quo_invmask_ = local_c0.quo_invmask_;
    this->size_ = local_c0.size_;
    this->max_size_ = local_c0.max_size_;
    (this->univ_size_).bits_ = local_c0.univ_size_.bits_;
    *(undefined4 *)&(this->univ_size_).field_0x4 = local_c0.univ_size_._4_4_;
    (this->univ_size_).mask_ = local_c0.univ_size_.mask_;
    (this->capa_size_).bits_ = local_c0.capa_size_.bits_;
    *(undefined4 *)&(this->capa_size_).field_0x4 = local_c0.capa_size_._4_4_;
    (this->capa_size_).mask_ = local_c0.capa_size_.mask_;
    (this->quo_size_).bits_ = local_c0.quo_size_.bits_;
    *(undefined4 *)&(this->quo_size_).field_0x4 = local_c0.quo_size_._4_4_;
    (this->quo_size_).mask_ = local_c0.quo_size_.mask_;
    if (local_c0.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.table_.chunks_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.table_.chunks_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.table_.chunks_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar2 = bijective_hash::split_mix_hasher::hash(&this->hasher_,key);
  quo = uVar2 >> ((ulong)(byte)(this->capa_size_).bits_ & 0x3f);
  slot_id_00 = uVar2 & (this->capa_size_).mask_;
  uVar2 = get_val_(this,slot_id_00);
  if (uVar2 == 0x7f) {
    compact_vector::set(&this->table_,slot_id_00,
                        val << 2 | quo << ((ulong)(byte)this->quo_shift_ & 0x3f) | 3);
  }
  else {
    local_c0.hasher_._0_8_ = 0;
    local_c8 = find_ass_cbit_(this,slot_id_00,(uint64_t *)&local_c0);
    bVar1 = get_vbit_(this,slot_id_00);
    if (bVar1) {
      bVar1 = find_item_(this,&local_c8,quo);
      if (bVar1) {
        set_val_(this,local_c8,val);
        return false;
      }
      local_c8 = local_c8 - 1 & (this->capa_size_).mask_;
      if (local_c0.hasher_._0_8_ != local_c8) {
        do {
          local_c0.hasher_._0_8_ = copy_from_right_(this,local_c0.hasher_._0_8_);
        } while (local_c0.hasher_._0_8_ != local_c8);
      }
      bVar1 = false;
    }
    else {
      if (local_c8 != 0xffffffffffffffff) {
        do {
          local_c8 = local_c8 + 1 & (this->capa_size_).mask_;
          bVar1 = get_cbit_(this,local_c8);
        } while (!bVar1);
        local_c8 = local_c8 - 1 & (this->capa_size_).mask_;
        if (local_c0.hasher_._0_8_ != local_c8) {
          do {
            local_c0.hasher_._0_8_ = copy_from_right_(this,local_c0.hasher_._0_8_);
          } while (local_c0.hasher_._0_8_ != local_c8);
        }
      }
      set_vbit_(this,slot_id_00,true);
      bVar1 = true;
    }
    set_cbit_(this,local_c0.hasher_._0_8_,bVar1);
    set_quo_(this,local_c0.hasher_._0_8_,quo);
    set_val_(this,local_c0.hasher_._0_8_,val);
  }
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        assert(key < univ_size_.size());
        assert(val < val_mask);

        if (max_size_ <= size_) {
            // expand
            this_type new_cht{univ_size_.bits(), capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
            new_cht.num_resize_ = num_resize_ + 1;
#endif
            clone(new_cht);
            *this = std::move(new_cht);
        }

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (is_vacant_(mod)) {
            // without collision
            update_slot_(mod, quo, val, true, true);
            ++size_;
            return true;
        }

        uint64_t empty_id = 0;
        uint64_t slot_id = find_ass_cbit_(mod, empty_id);

        if (!get_vbit_(mod)) {  // initial insertion in the group
            // create a new collision group
            if (slot_id != UINT64_MAX) {  // require to displace existing groups?
                do {
                    slot_id = right_(slot_id);
                } while (!get_cbit_(slot_id));

                slot_id = left_(slot_id);  // rightmost slot of the group

                while (empty_id != slot_id) {
                    empty_id = copy_from_right_(empty_id);
                }
            } else {
                // not inside other collision groups
            }
            set_vbit_(mod, true);
            set_cbit_(empty_id, true);
        } else {
            // collision group already exists
            if (find_item_(slot_id, quo)) {  // already registered?
                set_val_(slot_id, val);  // update
                return false;
            }

            slot_id = left_(slot_id);  // rightmost of the group

            // displace existing groups for creating an empty slot
            while (empty_id != slot_id) {
                empty_id = copy_from_right_(empty_id);
            }
            set_cbit_(empty_id, false);
        }

        set_quo_(empty_id, quo);
        set_val_(empty_id, val);

        ++size_;

        return true;
    }